

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O2

bool __thiscall
branch_and_reduce_algorithm::unconfinedReduction_a(branch_and_reduce_algorithm *this)

{
  int *piVar1;
  int iVar2;
  pointer piVar3;
  pointer pvVar4;
  pointer piVar5;
  int *piVar6;
  pointer piVar7;
  pointer piVar8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var9;
  FILE *__stream;
  long lVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int *piVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  vector<int,_std::allocator<int>_> *this_00;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  allocator_type local_a9;
  ulong local_a8;
  long local_a0;
  int z;
  fast_set *local_90;
  uint local_84;
  long local_80;
  vector<int,_std::allocator<int>_> extends;
  vector<int,_std::allocator<int>_> copyOfqs;
  
  local_84 = this->rn;
  local_90 = &this->used;
  lVar15 = 0;
  do {
    uVar11 = local_84;
    __stream = _stderr;
    if (this->n <= lVar15) {
      uVar13 = this->rn;
      if ((2 < debug) && (local_84 != uVar13 && this->depth <= this->maxDepth)) {
        debugString_abi_cxx11_((string *)&extends,this);
        fprintf(__stream,"%sunconfined: %d -> %d\n",
                extends.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start,(ulong)uVar11,(ulong)(uint)this->rn);
        std::__cxx11::string::~string((string *)&extends);
        uVar13 = this->rn;
      }
      return uVar11 != uVar13;
    }
    local_a0 = lVar15;
    if ((this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar15] < 0) {
      fast_set::clear(local_90);
      piVar3 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3[local_a0] = (this->used).uid;
      local_80 = local_a0 * 0x18;
      pvVar4 = (this->adj).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar5 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = *(pointer *)
                ((long)&pvVar4[local_a0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + 8);
      piVar7 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar8 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar19 = 0;
      for (piVar14 = pvVar4[local_a0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start; piVar14 != piVar6; piVar14 = piVar14 + 1) {
        iVar17 = *piVar14;
        if (piVar5[iVar17] < 0) {
          piVar3[iVar17] = (this->used).uid;
          iVar16 = (int)uVar19;
          uVar19 = (ulong)(iVar16 + 1);
          piVar7[iVar16] = iVar17;
          piVar8[iVar17] = 1;
        }
      }
      bVar23 = false;
      local_a8 = CONCAT44(local_a8._4_4_,1);
      do {
        if (bVar23) break;
        extends.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        extends.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        extends.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        iVar17 = (int)uVar19;
        uVar21 = 0;
        if (0 < iVar17) {
          uVar21 = uVar19;
        }
        uVar22 = 0;
LAB_0010cc63:
        if (uVar22 != uVar21) {
          iVar16 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar22];
          if ((this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar16] != 1) goto LAB_0010ccfc;
          z = -1;
          pvVar4 = (this->adj).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar18 = -1;
          for (piVar14 = pvVar4[iVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              piVar14 !=
              *(pointer *)
               ((long)&pvVar4[iVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data + 8); piVar14 = piVar14 + 1) {
            iVar2 = *piVar14;
            iVar12 = z;
            if ((((this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar2] < 0) &&
                ((this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar2] != (this->used).uid)) &&
               (bVar23 = -1 < iVar18, iVar18 = iVar2, iVar12 = iVar2, bVar23)) goto LAB_0010ccfc;
            z = iVar12;
          }
          if (iVar18 != -1) {
            if (-1 < iVar18) {
              std::vector<int,_std::allocator<int>_>::push_back(&extends,&z);
            }
            goto LAB_0010ccfc;
          }
          if (2 < REDUCTION) {
            _Var9._M_current =
                 (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
            *_Var9._M_current = 1;
            piVar6 = *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data + local_80 + 8);
            piVar3 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar16 = 1;
            for (piVar14 = *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>).
                                            _M_impl.super__Vector_impl_data + local_80);
                piVar14 != piVar6; piVar14 = piVar14 + 1) {
              if (piVar3[*piVar14] < 0) {
                _Var9._M_current[iVar16] = *piVar14;
                iVar16 = iVar16 + 1;
              }
            }
            std::vector<int,std::allocator<int>>::
            vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                      ((vector<int,std::allocator<int>> *)&copyOfqs,_Var9,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       (_Var9._M_current + iVar16),&local_a9);
            pushPacking(this,&copyOfqs);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&copyOfqs);
          }
          set(this,(int)local_a0,1);
          goto LAB_0010ce55;
        }
        lVar15 = (long)extends.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)extends.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        if (lVar15 == 0) {
LAB_0010ce55:
          bVar23 = true;
        }
        else {
          if (lVar15 == 1) {
            copyOfqs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start._0_4_ =
                 *extends.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
            this_00 = &this->b_vtcs;
            if (BRANCHING == 0x1f) {
              this_00 = &this->unconf_vtcs;
            }
            std::vector<int,_std::allocator<int>_>::push_back
                      (this_00,(value_type_conflict1 *)&copyOfqs);
          }
          iVar16 = *extends.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar3 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar3[iVar16] = (this->used).uid;
          pvVar4 = (this->adj).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar5 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar6 = *(pointer *)
                    ((long)&pvVar4[iVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data + 8);
          piVar7 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          for (piVar14 = pvVar4[iVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start; piVar14 != piVar6; piVar14 = piVar14 + 1)
          {
            iVar16 = *piVar14;
            if (piVar5[iVar16] < 0) {
              iVar18 = (this->used).uid;
              iVar2 = piVar3[iVar16];
              piVar3[iVar16] = iVar18;
              if (iVar2 == iVar18) {
                piVar1 = piVar8 + iVar16;
                *piVar1 = *piVar1 + 1;
              }
              else {
                iVar18 = (int)uVar19;
                uVar19 = (ulong)(iVar18 + 1);
                piVar7[iVar18] = iVar16;
                piVar8[iVar16] = 1;
              }
            }
          }
          local_a8 = CONCAT44(local_a8._4_4_,(int)local_a8 + 1);
          bVar23 = false;
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&extends.super__Vector_base<int,_std::allocator<int>_>);
      } while ((long)iVar17 <= (long)uVar22);
      if (1 < (int)local_a8 &&
          (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[local_a0] < 0) {
        fast_set::clear(local_90);
        piVar3 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar5 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar21 = 0;
        if (0 < (int)uVar19) {
          uVar21 = uVar19;
        }
        for (uVar22 = 0; uVar21 != uVar22; uVar22 = uVar22 + 1) {
          piVar5[piVar3[uVar22]] = (this->used).uid;
        }
        pvVar4 = (this->adj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar3 = (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar5 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar7 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (uVar22 = 0; uVar22 != uVar21; uVar22 = uVar22 + 1) {
          piVar3[(long)this->n + (long)(int)uVar22] = -1;
          piVar3[uVar22] = -1;
          iVar17 = piVar5[uVar22];
          if (piVar7[iVar17] == 2) {
            iVar16 = -1;
            iVar18 = -1;
            for (piVar14 = pvVar4[iVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                piVar14 !=
                *(pointer *)
                 ((long)&pvVar4[iVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data + 8); piVar14 = piVar14 + 1) {
              iVar2 = *piVar14;
              iVar12 = iVar18;
              if ((((this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar2] < 0) &&
                  ((this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar2] != (this->used).uid)) &&
                 ((iVar12 = iVar2, -1 < iVar18 &&
                  (bVar23 = -1 < iVar16, iVar16 = iVar2, iVar12 = iVar18, bVar23)))) {
                iVar16 = -1;
                iVar18 = iVar16;
                break;
              }
              iVar18 = iVar12;
            }
            iVar17 = iVar16;
            if (iVar18 < iVar16) {
              iVar17 = iVar18;
            }
            if (iVar16 < iVar18) {
              iVar16 = iVar18;
            }
            piVar3[uVar22] = iVar17;
            piVar3[(long)this->n + (long)(int)uVar22] = iVar16;
          }
        }
        lVar15 = 1;
        local_a8 = uVar21;
        for (uVar22 = 0; uVar22 != uVar21; uVar22 = uVar22 + 1) {
          piVar3 = (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((-1 < piVar3[uVar22]) && (-1 < piVar3[(long)this->n + (long)(int)uVar22])) {
            iVar17 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar22];
            fast_set::clear(local_90);
            lVar10 = local_a0;
            pvVar4 = (this->adj).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            piVar3 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar6 = *(pointer *)
                      ((long)&pvVar4[iVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data + 8);
            piVar5 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            for (piVar14 = pvVar4[iVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start; piVar14 != piVar6;
                piVar14 = piVar14 + 1) {
              if (piVar3[*piVar14] < 0) {
                piVar5[*piVar14] = (this->used).uid;
              }
            }
            _Var9._M_current =
                 (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
            lVar20 = lVar15;
LAB_0010d065:
            uVar21 = local_a8;
            if (lVar20 < (int)uVar19) {
              if (((_Var9._M_current[uVar22] != _Var9._M_current[lVar20]) ||
                  (_Var9._M_current[(long)(int)uVar22 + (long)this->n] !=
                   _Var9._M_current[this->n + lVar20])) ||
                 ((this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start
                  [(this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar20]] == (this->used).uid))
              goto LAB_0010d088;
              if (2 < REDUCTION) {
                *_Var9._M_current = 1;
                piVar6 = *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>).
                                          _M_impl.super__Vector_impl_data + local_80 + 8);
                piVar3 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                iVar17 = 1;
                for (piVar14 = *(int **)((long)&(pvVar4->
                                                super__Vector_base<int,_std::allocator<int>_>).
                                                _M_impl.super__Vector_impl_data + local_80);
                    piVar14 != piVar6; piVar14 = piVar14 + 1) {
                  if (piVar3[*piVar14] < 0) {
                    _Var9._M_current[iVar17] = *piVar14;
                    iVar17 = iVar17 + 1;
                  }
                }
                std::vector<int,std::allocator<int>>::
                vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                          ((vector<int,std::allocator<int>> *)&extends,_Var9,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                           (_Var9._M_current + iVar17),(allocator_type *)&copyOfqs);
                pushPacking(this,&extends);
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                          ((_Vector_base<int,_std::allocator<int>_> *)&extends);
              }
              set(this,(int)lVar10,1);
              break;
            }
          }
          lVar15 = lVar15 + 1;
        }
      }
    }
    lVar15 = local_a0 + 1;
  } while( true );
LAB_0010ccfc:
  uVar22 = uVar22 + 1;
  goto LAB_0010cc63;
LAB_0010d088:
  lVar20 = lVar20 + 1;
  goto LAB_0010d065;
}

Assistant:

bool branch_and_reduce_algorithm::unconfinedReduction_a()
{
    int oldn = rn;
#if 1
    std::vector<int> &NS = level;
    std::vector<int> &deg = iter;
    for (int v = 0; v < n; v++)
        if (x[v] < 0)
        {
            used.clear();
            used.add(v); // add v to set S
            int p = 1, size = 0;
            for (int u : adj[v]) // add N(v) to set S
                if (x[u] < 0)
                {
                    used.add(u);
                    NS[size++] = u;
                    deg[u] = 1;
                }
            bool ok = false;

            while (!ok) //
            {
                ok = true;
                std::vector<int> extends;

                for (int i = 0; i < size; i++)
                {
                    int const u = NS[i];
                    if (deg[u] != 1)
                    {
                        continue;
                    }
                    int z = -1;
                    for (int const w : adj[u])
                        if (x[w] < 0 && !used.get(w)) // w is in N(u) but not N(S)
                        {
                            if (z >= 0)
                            {
                                z = -2; // |N(u)\N(S)| >= 2
                                break;
                            }
                            z = w;
                        }
                    if (z == -1) // u is child with N(u)\N(S) = 0
                    {
                        if (REDUCTION >= 3)
                        {
                            std::vector<int> &qs = que;
                            int q = 0;
                            qs[q++] = 1;
                            for (int w : adj[v])
                                if (x[w] < 0)
                                    qs[q++] = w;
                            std::vector<int> copyOfqs(qs.begin(), qs.begin() + q);
                            pushPacking(copyOfqs);
                        }
                        set(v, 1);
                        goto whileloopend;
                    }
                    else if (z >= 0) // u is extending child
                    {
                        extends.push_back(z);
                    }
                }

                if (extends.size() > 0)
                {
                    if (extends.size() == 1)
                    {
                        // unconf_vtcs.push_back(extends[0]);
                        int vtx = extends[0];
                        if (BRANCHING == 31) unconf_vtcs.push_back(vtx);
                        else b_vtcs.push_back(vtx);
                    }
                    int z = extends[0];
                    ok = false;
                    used.add(z);
                    p++;
                    for (int w : adj[z])
                        if (x[w] < 0)
                        {
                            if (used.add(w))
                            {
                                NS[size++] = w;
                                deg[w] = 1;
                            }
                            else
                            {
                                deg[w]++;
                            }
                        }
                }
            }
        whileloopend:
            if (x[v] < 0 && p >= 2)
            {
                used.clear();
                for (int i = 0; i < size; i++)
                    used.add(NS[i]);
                std::vector<int> &vs = que;
                for (int i = 0; i < size; i++)
                {
                    vs[i] = vs[n + i] = -1;
                    int u = NS[i];
                    if (deg[u] != 2)
                        continue;
                    int v1 = -1, v2 = -1;
                    for (int w : adj[u])
                        if (x[w] < 0 && !used.get(w))
                        {
                            if (v1 < 0)
                                v1 = w;
                            else if (v2 < 0)
                                v2 = w;
                            else
                            {
                                v1 = v2 = -1;
                                break;
                            }
                        }
                    if (v1 > v2)
                    {
                        int t = v1;
                        v1 = v2;
                        v2 = t;
                    }
                    vs[i] = v1;
                    vs[n + i] = v2;
                }
                for (int i = 0; i < size; i++)
                    if (vs[i] >= 0 && vs[n + i] >= 0)
                    {
                        int u = NS[i];
                        used.clear();
                        for (int w : adj[u])
                            if (x[w] < 0)
                                used.add(w);
                        for (int j = i + 1; j < size; j++)
                            if (vs[i] == vs[j] && vs[n + i] == vs[n + j] && !used.get(NS[j]))
                            {
                                if (REDUCTION >= 3)
                                {
                                    std::vector<int> &qs = que;
                                    int q = 0;
                                    qs[q++] = 1;
                                    for (int w : adj[v])
                                        if (x[w] < 0)
                                            qs[q++] = w;
                                    std::vector<int> copyOfqs(qs.begin(), qs.begin() + q);
                                    pushPacking(copyOfqs);
                                }
                                set(v, 1);
                                goto forloopend;
                            }
                    }
            forloopend:;
            }
        }
    if (debug >= 3 && depth <= maxDepth && oldn != rn)
        fprintf(stderr, "%sunconfined: %d -> %d\n", debugString().c_str(), oldn, rn);
#endif //0
    return oldn != rn;
}